

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O2

int gpt2_decode(gpt2_model *model,ggml_gallocr_t allocr,gpt2_batch batch,int n_threads,
               vector<float,_std::allocator<float>_> *logits)

{
  pointer pgVar1;
  int32_t iVar2;
  id *piVar3;
  float *pfVar4;
  gpt2_pos *pgVar5;
  int8_t *piVar6;
  size_type sVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  ulong uVar11;
  ggml_cgraph *pgVar12;
  undefined8 uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  gpt2_seq_id *__v;
  ulong uVar18;
  int32_t i;
  long lVar19;
  gpt2_seq_id seq_id;
  size_type local_80;
  long local_78;
  ggml_cgraph *local_70;
  int32_t v;
  undefined4 uStack_64;
  pointer local_60;
  undefined8 local_50;
  long local_48;
  gpt2_seq_id *local_40;
  ulong local_38;
  
  iVar2 = batch.n_tokens;
  piVar3 = batch.token;
  pfVar4 = batch.embd;
  pgVar5 = batch.pos;
  lVar19 = (long)batch.n_tokens;
  if (lVar19 == 0) {
    printf("%s: n_tokens == 0","gpt2_decode");
    iVar10 = -1;
  }
  else {
    if ((batch.embd != (float *)0x0) != (batch.token == (id *)0x0)) {
      uVar13 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/gpt-2/main-batched.cpp"
                          ,0x376,"GGML_ASSERT(%s) failed",
                          "(!batch.token && batch.embd) || (batch.token && !batch.embd)");
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&v);
      _Unwind_Resume(uVar13);
    }
    local_80 = (size_type)(model->hparams).n_vocab;
    uVar18 = 0;
    uVar11 = 0;
    if (0 < batch.n_tokens) {
      uVar11 = (ulong)(uint)batch.n_tokens;
    }
    local_40 = batch.seq_id;
    __v = batch.seq_id;
    for (; uVar11 != uVar18; uVar18 = uVar18 + 1) {
      pgVar1 = (model->kv_cache).cells.
               super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>._M_impl.
               super__Vector_impl_data._M_start + ((model->kv_cache).head + (int)uVar18);
      pgVar1->pos = pgVar5[uVar18];
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &pgVar1->seq_id,__v);
      __v = __v + 1;
    }
    (model->kv_cache).n = (model->kv_cache).head + iVar2;
    pgVar12 = gpt2_graph(model,&batch,false);
    ggml_gallocr_alloc_graph(allocr,pgVar12);
    local_70 = pgVar12;
    if (piVar3 == (id *)0x0) {
      uVar13 = ggml_graph_get_tensor(pgVar12,"embd");
      ggml_element_size(uVar13);
      ggml_backend_tensor_set(uVar13,pfVar4,0);
    }
    else {
      uVar13 = ggml_graph_get_tensor(pgVar12,"inp_tokens");
      ggml_element_size(uVar13);
      ggml_backend_tensor_set(uVar13,piVar3,0);
      uVar13 = ggml_graph_get_tensor(pgVar12,"position");
      for (lVar16 = 0; uVar11 * 4 - lVar16 != 0; lVar16 = lVar16 + 4) {
        v = *(int32_t *)((long)pgVar5 + lVar16);
        ggml_backend_tensor_set(uVar13,&v,lVar16);
      }
    }
    local_50 = ggml_graph_get_tensor(local_70,"KQ_mask");
    uVar14 = (model->kv_cache).n;
    local_78 = lVar19;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&v,(long)(int)(uVar14 * iVar2),
               (allocator_type *)&seq_id);
    uVar18 = 0;
    if (0 < (int)uVar14) {
      uVar18 = (ulong)uVar14;
    }
    local_48 = (long)(int)uVar14 << 2;
    lVar19 = 0;
    uVar15 = 0;
    while (uVar15 != uVar11) {
      iVar10 = pgVar5[uVar15];
      seq_id = local_40[uVar15];
      lVar16 = lVar19;
      local_38 = uVar15;
      for (lVar17 = 0; uVar18 * 0x38 - lVar17 != 0; lVar17 = lVar17 + 0x38) {
        bVar8 = gpt2_kv_cell::has_seq_id
                          ((gpt2_kv_cell *)
                           ((long)&((model->kv_cache).cells.
                                    super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->pos + lVar17),&seq_id
                          );
        if ((!bVar8) ||
           (iVar10 < *(int *)((long)&((model->kv_cache).cells.
                                      super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->pos + lVar17))) {
          *(undefined4 *)(CONCAT44(uStack_64,v) + lVar16) = 0xff800000;
        }
        lVar16 = lVar16 + 4;
      }
      lVar19 = lVar19 + local_48;
      uVar15 = local_38 + 1;
    }
    ggml_backend_tensor_set(local_50,CONCAT44(uStack_64,v),0,(long)local_60 - CONCAT44(uStack_64,v))
    ;
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&v);
    cVar9 = ggml_backend_is_cpu(model->backend);
    pgVar12 = local_70;
    lVar19 = local_78;
    if (cVar9 != '\0') {
      ggml_backend_cpu_set_n_threads(model->backend,n_threads);
    }
    ggml_backend_graph_compute(model->backend,pgVar12);
    uVar13 = ggml_graph_node(pgVar12,0xffffffffffffffff);
    sVar7 = local_80;
    piVar6 = batch.logits;
    iVar10 = (int)local_80;
    if (batch.logits == (int8_t *)0x0) {
      std::vector<float,_std::allocator<float>_>::resize(logits,local_80);
      ggml_backend_tensor_get
                (uVar13,(logits->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start,(long)(((int)lVar19 + -1) * iVar10) << 2,
                 sVar7 << 2);
    }
    else {
      std::vector<float,_std::allocator<float>_>::resize(logits,(long)(iVar10 * (int)lVar19));
      lVar19 = sVar7 * 4;
      lVar16 = 0;
      for (uVar18 = 0; uVar11 != uVar18; uVar18 = uVar18 + 1) {
        if (piVar6[uVar18] != '\0') {
          ggml_backend_tensor_get
                    (uVar13,(long)(logits->super__Vector_base<float,_std::allocator<float>_>).
                                  _M_impl.super__Vector_impl_data._M_start + lVar16,lVar16,lVar19);
        }
        lVar16 = lVar16 + lVar19;
      }
    }
    uVar14 = (int)local_78 + (model->kv_cache).head;
    (model->kv_cache).head = uVar14;
    iVar10 = 0;
    if ((model->kv_cache).size <= uVar14) {
      printf("%s: cache.head >= cache.size\n","gpt2_decode");
      iVar10 = -2;
    }
  }
  return iVar10;
}

Assistant:

int gpt2_decode(
        struct gpt2_model &  model,
        ggml_gallocr_t       allocr,
        struct gpt2_batch    batch,
        int                  n_threads,
        std::vector<float> & logits) {
    const int32_t n_tokens = batch.n_tokens;
    const auto &  hparams  = model.hparams;
    const int     n_vocab  = hparams.n_vocab;

    if (n_tokens == 0) {
        printf("%s: n_tokens == 0", __func__);
        return -1;
    }

    GGML_ASSERT((!batch.token && batch.embd) || (batch.token && !batch.embd));

    auto & cache = model.kv_cache;

    for (int i = 0; i < n_tokens; i++) {
        cache.cells[cache.head + i].pos = batch.pos[i];
        cache.cells[cache.head + i].seq_id.insert(batch.seq_id[i]);
    }

    cache.n = cache.head + n_tokens;

    struct ggml_cgraph * gf = gpt2_graph(model, batch, false);

    // allocate tensors
    ggml_gallocr_alloc_graph(allocr, gf);

    // set the graph inputs
    if (batch.token) {
        struct ggml_tensor * inp_tokens = ggml_graph_get_tensor(gf, "inp_tokens");
        ggml_backend_tensor_set(inp_tokens, batch.token, 0, n_tokens*ggml_element_size(inp_tokens));

        struct ggml_tensor * position = ggml_graph_get_tensor(gf, "position");
        for (int i = 0; i < n_tokens; ++i) {
            int32_t v = batch.pos[i];
            ggml_backend_tensor_set(position, &v, i*sizeof(int32_t), sizeof(v));
        }
    } else {
        struct ggml_tensor * embd = ggml_graph_get_tensor(gf, "embd");
        ggml_backend_tensor_set(embd, batch.embd, 0, n_tokens * hparams.n_embd * ggml_element_size(embd));
    }

    {
        struct ggml_tensor * KQ_mask = ggml_graph_get_tensor(gf, "KQ_mask");
        const auto & kv_cache = model.kv_cache;
        const int32_t n_tokens = batch.n_tokens;
        const int32_t n_kv     = kv_cache.n;

        std::vector<float> data_buf(n_kv*n_tokens);
        const float neg_inf_v = -INFINITY;

        for (int h = 0; h < 1; ++h) {
            int h_offset = h*(n_kv*n_tokens);
            for (int j = 0; j < n_tokens; ++j) {
                const gpt2_pos    pos    = batch.pos[j];
                const gpt2_seq_id seq_id = batch.seq_id[j];

                for (int i = 0; i < n_kv; ++i) {
                    if (!kv_cache.cells[i].has_seq_id(seq_id) || kv_cache.cells[i].pos > pos) {
                        data_buf[h_offset + j*n_kv + i] = neg_inf_v;
                    }
                }
            }
        }

        ggml_backend_tensor_set(KQ_mask, data_buf.data(), 0, data_buf.size() * sizeof(float));
    }

    // run the computation
    if (ggml_backend_is_cpu(model.backend)) {
        ggml_backend_cpu_set_n_threads(model.backend, n_threads);
    }
    ggml_backend_graph_compute(model.backend, gf);

    //if (n_past%100 == 0) {
    //    ggml_graph_print   (&gf);
    //    ggml_graph_dump_dot(&gf, NULL, "gpt-2.dot");
    //}

    // in this case, the output tensor is the last one in the graph
    struct ggml_tensor * inpL = ggml_graph_node(gf, -1);

    if (batch.logits) {
        // return logits for all tokens
        logits.resize(n_vocab*n_tokens);
        for (int32_t i = 0; i < n_tokens; i++) {
            if (batch.logits[i] == 0) {
                continue;
            }
            ggml_backend_tensor_get(inpL, logits.data() + n_vocab*i, n_vocab*i*sizeof(float), sizeof(float)*n_vocab);
        }
    } else {
        // return result just for the last token
        logits.resize(n_vocab);
        ggml_backend_tensor_get(inpL, logits.data(), (n_vocab*(n_tokens-1))*sizeof(float), sizeof(float)*n_vocab);
    }

    // update the kv ring buffer
    cache.head += n_tokens;

    // ensure kv cache head points to a valid index.
    if (cache.head >= cache.size) {
        printf("%s: cache.head >= cache.size\n", __func__);
        return -2;
    }

    return 0;
}